

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTo.hpp
# Opt level: O0

EqualTo<std::__cxx11::string> * __thiscall
ut11::Operands::EqualTo<std::__cxx11::string>::GetErrorMessage<std::__cxx11::string>
          (EqualTo<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  utility local_1f8 [32];
  utility local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream errorMessage;
  ostream local_198 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = in_RDX;
  actual_local = actual;
  this_local = (EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected ");
  utility::ToString<std::__cxx11::string>
            (local_1d8,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)actual
            );
  poVar1 = std::operator<<(poVar1,(string *)local_1d8);
  poVar1 = std::operator<<(poVar1," but was ");
  utility::ToString<std::__cxx11::string>(local_1f8,local_20);
  std::operator<<(poVar1,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected " << utility::ToString(m_expected) << " but was " << utility::ToString(actual);
				return errorMessage.str();
			}